

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O3

int disposition_set_role(DISPOSITION_HANDLE disposition,role role_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  int iVar2;
  DISPOSITION_INSTANCE *disposition_instance;
  
  if (disposition == (DISPOSITION_HANDLE)0x0) {
    iVar2 = 0x21ac;
  }
  else {
    item_value = amqpvalue_create_boolean(role_value);
    if (item_value == (AMQP_VALUE)0x0) {
      iVar2 = 0x21b4;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(disposition->composite_value,0,item_value);
      iVar2 = 0x21ba;
      if (iVar1 == 0) {
        iVar2 = 0;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return iVar2;
}

Assistant:

int disposition_set_role(DISPOSITION_HANDLE disposition, role role_value)
{
    int result;

    if (disposition == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        DISPOSITION_INSTANCE* disposition_instance = (DISPOSITION_INSTANCE*)disposition;
        AMQP_VALUE role_amqp_value = amqpvalue_create_role(role_value);
        if (role_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(disposition_instance->composite_value, 0, role_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(role_amqp_value);
        }
    }

    return result;
}